

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

void __thiscall
ON_BumpFunction::Internal_EvaluateQuinticBump
          (ON_BumpFunction *this,double t,double dt,int der_count,double *value)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double b1;
  double b;
  double a;
  double a1;
  double a2;
  double *value_local;
  int der_count_local;
  double dt_local;
  double t_local;
  ON_BumpFunction *this_local;
  
  a2 = (double)value;
  value_local._4_4_ = der_count;
  if (1.0 <= ABS(t)) {
    while (-1 < value_local._4_4_) {
      *(undefined8 *)a2 = 0;
      a2 = (double)((long)a2 + 8);
      value_local._4_4_ = value_local._4_4_ + -1;
    }
  }
  else {
    dVar1 = 1.0 - t;
    dVar2 = dVar1 * dVar1 * dVar1;
    dVar3 = t * (t * 6.0 + 3.0) + 1.0;
    *value = dVar2 * dVar3;
    if (0 < der_count) {
      dVar4 = dVar1 * dVar1 * -3.0;
      dVar5 = t * 12.0 + 3.0;
      value[1] = dt * (dVar4 * dVar3 + dVar5 * dVar2);
      if ((1 < der_count) &&
         (value[2] = dt * dt * (dVar4 * 2.0 * dVar5 + dVar1 * 6.0 * dVar3 + dVar2 * 12.0),
         2 < der_count)) {
        a2 = (double)(value + 3);
        value_local._4_4_ = der_count + -2;
        while (value_local._4_4_ != 0) {
          *(undefined8 *)a2 = 0;
          a2 = (double)((long)a2 + 8);
          value_local._4_4_ = value_local._4_4_ + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void ON_BumpFunction::Internal_EvaluateQuinticBump(double t, double dt, int der_count, double* value) const
{
  // c(t) = (1-t)^3 * (1 + 3t + 6t^2)
  //bool neg = (t<0.0);
  //t = fabs(t);
  if ( fabs(t) < 1.0)
  {
    double a2 = (1-t);
    double a1 = a2*a2;
    double a = a1*a2;
    double b = 1.0 + t*(3.0 + 6.0*t);
    value[0] = a*b;
    if (der_count>0)
    {
      a1 *= -3.0;
      double b1 = 3.0 + 12.0*t;
      value[1] = dt*(a1*b + b1*a);
      //if ( neg )
      //  value[1] = - value[1];
      if ( der_count > 1 )
      {
        value[2] = dt*dt*(6.0*a2*b + 12.0*a + 2.0*a1*b1);
        if ( der_count > 2 )
        {
          der_count-=2;
          value += 3;
          while ( der_count-- )
            *value++ = 0.0;
        }
      }
    }
  }
  else
  {
    while ( der_count-- >= 0 )
      *value++ = 0.0;
  }
}